

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O2

void __thiscall glauber::WoodsSaxonNucleus::sample_nucleons_impl(WoodsSaxonNucleus *this)

{
  pointer pNVar1;
  Nucleon *nucleon;
  pointer pNVar2;
  result_type_conflict rVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  pNVar1 = (this->super_Nucleus).nucleons_.
           super__Vector_base<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pNVar2 = (this->super_Nucleus).nucleons_.
                super__Vector_base<glauber::Nucleon,_std::allocator<glauber::Nucleon>_>._M_impl.
                super__Vector_impl_data._M_start; pNVar2 != pNVar1; pNVar2 = pNVar2 + 1) {
    rVar3 = std::piecewise_linear_distribution<double>::operator()
                      (&this->woods_saxon_dist_,
                       (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)random::engine);
    auVar7._0_8_ = random::cos_theta<double>();
    dVar4 = random::phi<double>();
    auVar7._8_8_ = 0;
    auVar7 = vfnmadd213sd_fma(auVar7,auVar7,ZEXT816(0x3ff0000000000000));
    if (auVar7._0_8_ < 0.0) {
      dVar5 = sqrt(auVar7._0_8_);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar7,auVar7);
      dVar5 = auVar7._0_8_;
    }
    dVar6 = cos(dVar4);
    dVar4 = sin(dVar4);
    pNVar2->x_ = dVar6 * dVar5 * rVar3 + (this->super_Nucleus).offset_;
    pNVar2->y_ = dVar4 * dVar5 * rVar3;
    pNVar2->ncoll_ = 0;
  }
  return;
}

Assistant:

void WoodsSaxonNucleus::sample_nucleons_impl() {
  for (auto&& nucleon : *this) {
    // Sample spherical radius from Woods-Saxon distribution.
    auto r = woods_saxon_dist_(random::engine);

    // Sample isotropic spherical angles.
    auto cos_theta = random::cos_theta<double>();
    auto phi = random::phi<double>();

    // Convert to transverse Cartesian coordinates
    auto r_sin_theta = r * std::sqrt(1. - cos_theta*cos_theta);
    auto x = r_sin_theta * std::cos(phi);
    auto y = r_sin_theta * std::sin(phi);

    set_nucleon_position(nucleon, x, y);
  }
  // XXX: re-center nucleon positions?
}